

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMeshGetDomainsByName(FmsMesh mesh,char *domain_name,FmsInt *num_domains,FmsDomain **domains)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long *in_RCX;
  long *in_RDX;
  char *in_RSI;
  long in_RDI;
  FmsInt domain_name_id;
  char **domain_names;
  FmsInt num_domain_names;
  long local_40;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RSI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x40);
    lVar2 = *(long *)(in_RDI + 0x50);
    for (local_40 = 0; local_40 != lVar1; local_40 = local_40 + 1) {
      iVar3 = strcmp(in_RSI,*(char **)(lVar2 + local_40 * 8));
      if (iVar3 == 0) {
        if (in_RDX != (long *)0x0) {
          *in_RDX = *(long *)(*(long *)(in_RDI + 0x48) + 8 + local_40 * 8) -
                    *(long *)(*(long *)(in_RDI + 0x48) + local_40 * 8);
        }
        if (in_RCX != (long *)0x0) {
          *in_RCX = *(long *)(in_RDI + 0x28) +
                    *(long *)(*(long *)(in_RDI + 0x48) + local_40 * 8) * 8;
        }
        return 0;
      }
    }
    local_4 = 4;
  }
  return local_4;
}

Assistant:

int FmsMeshGetDomainsByName(FmsMesh mesh, const char *domain_name,
                            FmsInt *num_domains, FmsDomain **domains) {
  if (!mesh) { E_RETURN(1); }
  if (!domain_name) { E_RETURN(2); }
  const FmsInt num_domain_names = mesh->num_domain_names;
  char **domain_names = mesh->domain_names;
  FmsInt domain_name_id = 0;
  for ( ; 1; domain_name_id++) {
    if (domain_name_id == num_domain_names) { E_RETURN(4); }
    if (strcmp(domain_name, domain_names[domain_name_id]) == 0) { break; }
  }
  if (num_domains) {
    *num_domains = mesh->domain_offsets[domain_name_id+1] -
                   mesh->domain_offsets[domain_name_id];
  }
  if (domains) {
    *domains = mesh->domains + mesh->domain_offsets[domain_name_id];
  }
  return 0;
}